

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

bool __thiscall
MutableS2ShapeIndex::MakeIndexCell
          (MutableS2ShapeIndex *this,S2PaddedCell *pcell,
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          *edges,InteriorTracker *tracker)

{
  pointer ppCVar1;
  pointer ppCVar2;
  uint n;
  uint uVar3;
  S2ShapeIndexCell *this_00;
  S2ClippedShape *pSVar4;
  int32 *piVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar11;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar12;
  pointer piVar13;
  pointer ppCVar14;
  int iVar15;
  const_iterator __end1;
  ulong uVar16;
  ulong uVar17;
  S2ClippedShape *pSVar18;
  int32 iVar19;
  iterator position;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *__range1;
  int local_94;
  S2Point local_48;
  
  ppCVar1 = (edges->
            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (edges->
            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((ppCVar1 != ppCVar2) ||
     ((tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (ppCVar1 != ppCVar2) {
      iVar15 = 0;
      ppCVar14 = ppCVar1;
      do {
        iVar15 = (uint)(pcell->level_ < (*ppCVar14)->face_edge->max_level) + iVar15;
        if ((this->options_).max_edges_per_cell_ < iVar15) {
          return false;
        }
        ppCVar14 = ppCVar14 + 1;
      } while (ppCVar14 != ppCVar2);
    }
    if ((ppCVar1 != ppCVar2) && (tracker->is_active_ != false)) {
      uVar17 = (pcell->id_).id_;
      if (uVar17 - (~uVar17 & uVar17 - 1) != (tracker->next_cellid_).id_) {
        S2PaddedCell::GetEntryVertex(&local_48,pcell);
        (tracker->b_).c_[2] = local_48.c_[2];
        (tracker->b_).c_[0] = local_48.c_[0];
        (tracker->b_).c_[1] = local_48.c_[1];
      }
      S2PaddedCell::GetCenter(&local_48,pcell);
      InteriorTracker::DrawTo(tracker,&local_48);
      TestAllEdges(edges,tracker);
    }
    n = CountShapes(edges,&tracker->shape_ids_);
    this_00 = (S2ShapeIndexCell *)operator_new(0x10);
    *(undefined8 *)
     &(this_00->shapes_).super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> =
         0;
    (this_00->shapes_).super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>.
    field_7.pointer_ = (S2ClippedShape *)0x0;
    pSVar4 = S2ShapeIndexCell::add_shapes(this_00,n);
    if (0 < (int)n) {
      piVar13 = (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      paVar11 = &pSVar4->field_3;
      uVar17 = 0;
      local_94 = 0;
      do {
        uVar16 = (ulong)local_94;
        ppCVar1 = (edges->
                  super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(edges->
                      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3;
        iVar15 = (int)((ulong)((long)(this->shapes_).
                                     super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->shapes_).
                                    super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar19 = iVar15;
        if (uVar7 != uVar16) {
          iVar19 = ppCVar1[uVar16]->face_edge->shape_id;
        }
        if (piVar13 !=
            (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          iVar15 = *piVar13;
        }
        pSVar18 = pSVar4 + uVar17;
        if (iVar15 < iVar19) {
          pSVar18->shape_id_ = iVar15;
          *(undefined4 *)&pSVar18->field_0x4 = 1;
          piVar13 = piVar13 + 1;
        }
        else {
          uVar9 = uVar16;
          iVar8 = local_94;
          if (uVar16 < uVar7) {
            do {
              if (ppCVar1[uVar9]->face_edge->shape_id != iVar19) break;
              uVar9 = uVar9 + 1;
            } while (uVar9 < uVar7);
            iVar8 = (int)uVar9;
          }
          uVar3 = iVar8 - local_94;
          pSVar18->shape_id_ = iVar19;
          *(uint *)&pSVar18->field_0x4 = uVar3 * 2;
          if (5 < uVar3 * 2) {
            uVar7 = (ulong)uVar3 << 2;
            if ((int)uVar3 < 0) {
              uVar7 = 0xffffffffffffffff;
            }
            piVar5 = (int32 *)operator_new__(uVar7);
            (pSVar18->field_3).edges_ = piVar5;
          }
          if (local_94 < iVar8) {
            ppCVar1 = (edges->
                      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar6 = (long)iVar8 - uVar16;
            lVar10 = 0;
            do {
              paVar12 = paVar11;
              if (5 < *(uint *)&pSVar18->field_0x4) {
                paVar12 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pSVar18->field_3).edges_;
              }
              *(undefined4 *)((long)paVar12 + lVar10) =
                   *(undefined4 *)(**(long **)((long)ppCVar1 + lVar10 * 2 + uVar16 * 8) + 4);
              lVar10 = lVar10 + 4;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
          }
          local_94 = iVar8;
          if (iVar15 == iVar19) {
            pSVar18->field_0x4 = pSVar18->field_0x4 | 1;
            piVar13 = piVar13 + 1;
          }
        }
        uVar17 = uVar17 + 1;
        paVar11 = paVar11 + 2;
      } while (uVar17 != n);
    }
    position = gtl::internal_btree::
               btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
               ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                      *)&this->cell_map_);
    local_48.c_[0] = (VType)(pcell->id_).id_;
    local_48.c_[1] = (VType)this_00;
    gtl::internal_btree::
    btree<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
    ::insert_hint_unique<std::pair<S2CellId_const,S2ShapeIndexCell*>>
              ((btree<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
                *)&this->cell_map_,position,(key_type *)&local_48,
               (pair<const_S2CellId,_S2ShapeIndexCell_*> *)&local_48);
    if ((tracker->is_active_ != false) &&
       ((edges->
        super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (edges->
        super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
        )._M_impl.super__Vector_impl_data._M_finish)) {
      S2PaddedCell::GetExitVertex(&local_48,pcell);
      InteriorTracker::DrawTo(tracker,&local_48);
      TestAllEdges(edges,tracker);
      uVar7 = (pcell->id_).id_;
      uVar17 = uVar7 + (-uVar7 & uVar7) * 2;
      (tracker->next_cellid_).id_ = uVar17 - (~uVar17 & (uVar7 + (-uVar7 & uVar7) * 2) - 1);
    }
  }
  return true;
}

Assistant:

bool MutableS2ShapeIndex::MakeIndexCell(const S2PaddedCell& pcell,
                                        const vector<const ClippedEdge*>& edges,
                                        InteriorTracker* tracker) {
  if (edges.empty() && tracker->shape_ids().empty()) {
    // No index cell is needed.  (In most cases this situation is detected
    // before we get to this point, but this can happen when all shapes in a
    // cell are removed.)
    return true;
  }

  // Count the number of edges that have not reached their maximum level yet.
  // Return false if there are too many such edges.
  int count = 0;
  for (const ClippedEdge* edge : edges) {
    count += (pcell.level() < edge->face_edge->max_level);
    if (count > options_.max_edges_per_cell())
      return false;
  }

  // Possible optimization: Continue subdividing as long as exactly one child
  // of "pcell" intersects the given edges.  This can be done by finding the
  // bounding box of all the edges and calling ShrinkToFit():
  //
  // S2CellId cellid = pcell.ShrinkToFit(GetRectBound(edges));
  //
  // Currently this is not beneficial; it slows down construction by 4-25%
  // (mainly computing the union of the bounding rectangles) and also slows
  // down queries (since more recursive clipping is required to get down to
  // the level of a spatial index cell).  But it may be worth trying again
  // once "contains_center" is computed and all algorithms are modified to
  // take advantage of it.

  // We update the InteriorTracker as follows.  For every S2Cell in the index
  // we construct two edges: one edge from entry vertex of the cell to its
  // center, and one from the cell center to its exit vertex.  Here "entry"
  // and "exit" refer the S2CellId ordering, i.e. the order in which points
  // are encountered along the S2 space-filling curve.  The exit vertex then
  // becomes the entry vertex for the next cell in the index, unless there are
  // one or more empty intervening cells, in which case the InteriorTracker
  // state is unchanged because the intervening cells have no edges.

  // Shift the InteriorTracker focus point to the center of the current cell.
  if (tracker->is_active() && !edges.empty()) {
    if (!tracker->at_cellid(pcell.id())) {
      tracker->MoveTo(pcell.GetEntryVertex());
    }
    tracker->DrawTo(pcell.GetCenter());
    TestAllEdges(edges, tracker);
  }
  // Allocate and fill a new index cell.  To get the total number of shapes we
  // need to merge the shapes associated with the intersecting edges together
  // with the shapes that happen to contain the cell center.
  const ShapeIdSet& cshape_ids = tracker->shape_ids();
  int num_shapes = CountShapes(edges, cshape_ids);
  S2ShapeIndexCell* cell = new S2ShapeIndexCell;
  S2ClippedShape* base = cell->add_shapes(num_shapes);

  // To fill the index cell we merge the two sources of shapes: "edge shapes"
  // (those that have at least one edge that intersects this cell), and
  // "containing shapes" (those that contain the cell center).  We keep track
  // of the index of the next intersecting edge and the next containing shape
  // as we go along.  Both sets of shape ids are already sorted.
  int enext = 0;
  ShapeIdSet::const_iterator cnext = cshape_ids.begin();
  for (int i = 0; i < num_shapes; ++i) {
    S2ClippedShape* clipped = base + i;
    int eshape_id = num_shape_ids(), cshape_id = eshape_id;  // Sentinels
    if (enext != edges.size()) {
      eshape_id = edges[enext]->face_edge->shape_id;
    }
    if (cnext != cshape_ids.end()) {
      cshape_id = *cnext;
    }
    int ebegin = enext;
    if (cshape_id < eshape_id) {
      // The entire cell is in the shape interior.
      clipped->Init(cshape_id, 0);
      clipped->set_contains_center(true);
      ++cnext;
    } else {
      // Count the number of edges for this shape and allocate space for them.
      while (enext < edges.size() &&
             edges[enext]->face_edge->shape_id == eshape_id) {
        ++enext;
      }
      clipped->Init(eshape_id, enext - ebegin);
      for (int e = ebegin; e < enext; ++e) {
        clipped->set_edge(e - ebegin, edges[e]->face_edge->edge_id);
      }
      if (cshape_id == eshape_id) {
        clipped->set_contains_center(true);
        ++cnext;
      }
    }
  }
  // UpdateEdges() visits cells in increasing order of S2CellId, so during
  // initial construction of the index all insertions happen at the end.  It
  // is much faster to give an insertion hint in this case.  Otherwise the
  // hint doesn't do much harm.  With more effort we could provide a hint even
  // during incremental updates, but this is probably not worth the effort.
  cell_map_.insert(cell_map_.end(), std::make_pair(pcell.id(), cell));

  // Shift the InteriorTracker focus point to the exit vertex of this cell.
  if (tracker->is_active() && !edges.empty()) {
    tracker->DrawTo(pcell.GetExitVertex());
    TestAllEdges(edges, tracker);
    tracker->set_next_cellid(pcell.id().next());
  }
  return true;
}